

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-hparams.cpp
# Opt level: O1

uint32_t __thiscall llama_hparams::n_embd_k_s(llama_hparams *this)

{
  int iVar1;
  
  if (this->wkv_head_size != 0) {
    return this->n_embd * this->token_shift_count;
  }
  iVar1 = this->ssm_d_conv - 1;
  if (this->ssm_d_conv == 0) {
    iVar1 = 0;
  }
  return iVar1 * this->ssm_d_inner;
}

Assistant:

uint32_t llama_hparams::n_embd_k_s() const {
    if (wkv_head_size != 0) {
        // for RWKV models
        return token_shift_count * n_embd;
    }

    // TODO: maybe support other convolution strides than 1
    // NOTE: since the first column of the conv_state is shifted out each time, it's not actually needed
    return (ssm_d_conv > 0 ? ssm_d_conv - 1 : 0) * ssm_d_inner;
}